

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

void sobelFilter(Mat *image)

{
  _InputArray local_250;
  Mat out;
  _OutputArray local_1d8;
  _InputArray local_1c0;
  Mat abs_grad_y;
  Mat grad_y;
  Mat abs_grad_x;
  Mat grad_x;
  
  cv::Mat::Mat(&grad_x);
  _abs_grad_x = 0x1010000;
  _grad_y = 0x2010000;
  cv::Sobel((_InputArray *)&abs_grad_x,(_OutputArray *)&grad_y,*(uint *)image & 7,1,0,3,1.0,0.0,4);
  cv::Mat::Mat(&abs_grad_x);
  _grad_y = 0x1010000;
  _abs_grad_y = 0x2010000;
  cv::convertScaleAbs((_InputArray *)&grad_y,(_OutputArray *)&abs_grad_y,1.0,0.0);
  cv::Mat::Mat(&grad_y);
  _abs_grad_y = 0x1010000;
  _out = 0x2010000;
  cv::Sobel((_InputArray *)&abs_grad_y,(_OutputArray *)&out,*(uint *)image & 7,0,1,3,1.0,0.0,4);
  cv::Mat::Mat(&abs_grad_y);
  local_250.sz.width = 0;
  local_250.sz.height = 0;
  _out = 0x1010000;
  local_250.flags = 0x2010000;
  local_250.obj = (_InputArray *)&abs_grad_y;
  cv::convertScaleAbs((_InputArray *)&out,(_OutputArray *)&local_250,1.0,0.0);
  cv::Mat::Mat(&out);
  local_250.sz.width = 0;
  local_250.sz.height = 0;
  local_250.flags = 0x1010000;
  local_1c0.sz.width = 0;
  local_1c0.sz.height = 0;
  local_1d8.super__InputArray.sz.width = 0;
  local_1d8.super__InputArray.sz.height = 0;
  local_1c0.flags = 0x1010000;
  local_1d8.super__InputArray.flags = 0x2010000;
  local_250.obj = (_InputArray *)&abs_grad_x;
  local_1d8.super__InputArray.obj = (_InputArray *)&out;
  local_1c0.obj = (_InputArray *)&abs_grad_y;
  cv::addWeighted(&local_250,0.5,&local_1c0,0.5,0.0,&local_1d8,-1);
  cv::Mat::operator=(image,&out);
  cv::Mat::~Mat(&out);
  cv::Mat::~Mat(&abs_grad_y);
  cv::Mat::~Mat(&grad_y);
  cv::Mat::~Mat(&abs_grad_x);
  cv::Mat::~Mat(&grad_x);
  return;
}

Assistant:

void sobelFilter(cv::Mat & image) {
	cv::Mat grad_x;
	cv::Sobel(image, grad_x, image.depth(), 1, 0);
	cv::Mat abs_grad_x;
	cv::convertScaleAbs(grad_x, abs_grad_x);

	cv::Mat grad_y;
	cv::Sobel(image, grad_y, image.depth(), 0, 1);
	cv::Mat abs_grad_y;
	cv::convertScaleAbs(grad_y, abs_grad_y);

	cv::Mat out;
	cv::addWeighted(abs_grad_x, 0.5, abs_grad_y, 0.5, 0, out);

	image = out;
}